

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void __thiscall Js::DynamicProfileInfo::DynamicProfileInfo(DynamicProfileInfo *this)

{
  (this->loopFlags).ptr = (BVFixed *)0x0;
  (this->dynamicProfileFunctionInfo).ptr = (DynamicProfileFunctionInfo *)0x0;
  (this->callSiteInfo).ptr = (CallSiteInfo *)0x0;
  (this->callApplyTargetInfo).ptr = (CallSiteInfo *)0x0;
  (this->returnTypeInfo).ptr = (ValueType *)0x0;
  (this->divideTypeInfo).ptr = (ValueType *)0x0;
  (this->switchTypeInfo).ptr = (ValueType *)0x0;
  (this->ldLenInfo).ptr = (LdLenInfo *)0x0;
  (this->ldElemInfo).ptr = (LdElemInfo *)0x0;
  (this->stElemInfo).ptr = (StElemInfo *)0x0;
  (this->arrayCallSiteInfo).ptr = (ArrayCallSiteInfo *)0x0;
  (this->parameterInfo).ptr = (ValueType *)0x0;
  (this->fldInfo).ptr = (FldInfo *)0x0;
  (this->slotInfo).ptr = (ValueType *)0x0;
  (this->loopImplicitCallFlags).ptr = (ImplicitCallFlags *)0x0;
  ThisInfo::ThisInfo(&this->thisInfo);
  (this->functionBody).ptr = (FunctionBody *)0x0;
  this->hasFunctionBody = false;
  return;
}

Assistant:

DynamicProfileInfo::DynamicProfileInfo()
    {
        hasFunctionBody = false;
    }